

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O1

float __thiscall
basisu::palette_index_reorderer::pick_side
          (palette_index_reorderer *this,uint32_t num_syms,uint32_t entry_to_move,
          pEntry_dist_func pDist_func,void *pCtx,float dist_func_weight)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  uVar1 = (this->m_entries_picked).m_size;
  uVar4 = (ulong)uVar1;
  if (uVar4 == 0) {
    fVar13 = 0.0;
    fVar17 = 0.0;
    fVar15 = 0.0;
  }
  else {
    fVar15 = 0.0;
    iVar6 = -2;
    uVar7 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      uVar2 = (this->m_entries_picked).m_p[uVar7];
      if ((int)uVar2 < (int)entry_to_move) {
        iVar10 = uVar2 * num_syms + entry_to_move;
      }
      else {
        iVar10 = uVar2 + entry_to_move * num_syms;
      }
      if ((ulong)(this->m_hist).m_size <= (ulong)(long)iVar10) {
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,
                      "const T &basisu::vector<unsigned int>::operator[](size_t) const [T = unsigned int]"
                     );
      }
      iVar5 = iVar6 + 1 + uVar1;
      iVar11 = (this->m_hist).m_p[iVar10] * iVar5;
      uVar7 = uVar7 + 1;
      fVar15 = fVar15 + (float)iVar11;
      iVar12 = iVar11;
      iVar10 = 0;
      if (iVar5 < 0) {
        iVar12 = 0;
        iVar10 = iVar11;
      }
      iVar9 = iVar9 - iVar10;
      iVar8 = iVar8 + iVar12;
      iVar6 = iVar6 + -2;
    } while (uVar4 != uVar7);
    fVar17 = (float)iVar8;
    fVar13 = (float)iVar9;
  }
  if (pDist_func != (pEntry_dist_func)0x0) {
    if (uVar4 == 0) {
      __assert_fail("m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x195,"T &basisu::vector<unsigned int>::front() [T = unsigned int]");
    }
    fVar15 = (*pDist_func)(entry_to_move,*(this->m_entries_picked).m_p,pCtx);
    uVar3 = (this->m_entries_picked).m_size;
    if (uVar3 == 0) {
      __assert_fail("m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x198,"T &basisu::vector<unsigned int>::back() [T = unsigned int]");
    }
    fVar16 = 1.0 - dist_func_weight;
    fVar18 = (dist_func_weight + 1.0) - fVar16;
    fVar14 = (*pDist_func)(entry_to_move,(this->m_entries_picked).m_p[uVar3 - 1],pCtx);
    fVar15 = (fVar15 * fVar18 + fVar16) * fVar17 - (fVar14 * fVar18 + fVar16) * fVar13;
  }
  return fVar15;
}

Assistant:

float palette_index_reorderer::pick_side(uint32_t num_syms, uint32_t entry_to_move, pEntry_dist_func pDist_func, void *pCtx, float dist_func_weight)
	{
		float which_side = 0;

		int l_count = 0, r_count = 0;
		for (uint32_t j = 0; j < m_entries_picked.size(); j++)
		{
			const int count = get_hist(entry_to_move, m_entries_picked[j], num_syms), r = ((int)m_entries_picked.size() + 1 - 2 * (j + 1));
			which_side += static_cast<float>(r * count);
			if (r >= 0)
				l_count += r * count;
			else
				r_count += -r * count;
		}

		if (pDist_func)
		{
			float w_left = lerp(1.0f - dist_func_weight, 1.0f + dist_func_weight, (*pDist_func)(entry_to_move, m_entries_picked.front(), pCtx));
			float w_right = lerp(1.0f - dist_func_weight, 1.0f + dist_func_weight, (*pDist_func)(entry_to_move, m_entries_picked.back(), pCtx));
			which_side = w_left * l_count - w_right * r_count;
		}
		return which_side;
	}